

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

string * read_from_file_abi_cxx11_(string *__return_storage_ptr__,char *infile)

{
  uint *puVar1;
  char cVar2;
  ostream *poVar3;
  long local_220;
  ifstream instream;
  undefined1 local_210 [8];
  uint auStack_208 [124];
  
  std::ifstream::ifstream(&local_220,infile,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    puVar1 = (uint *)((long)auStack_208 + *(long *)(local_220 + -0x18));
    *puVar1 = *puVar1 & 0xffffefff;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,local_210,0xffffffffffffffff,0,0xffffffff);
    std::ifstream::~ifstream(&local_220);
    return __return_storage_ptr__;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Couldn\'t open file: ");
  poVar3 = std::operator<<(poVar3,infile);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(-1);
}

Assistant:

inline std::string
read_from_file(char const* infile)
{
    std::ifstream instream(infile);
    if (!instream.is_open()) {
        std::cerr << "Couldn't open file: " << infile << std::endl;
        exit(-1);
    }
    instream.unsetf(std::ios::skipws);      // No white space skipping!
    return std::string(std::istreambuf_iterator<char>(instream.rdbuf()),
        std::istreambuf_iterator<char>());
}